

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdtrans.c
# Opt level: O2

jvirt_barray_ptr * jpeg_read_coefficients(j_decompress_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  uint uVar2;
  jvirt_barray_ptr *ppjVar3;
  jpeg_progress_mgr *pjVar4;
  long lVar5;
  int iVar6;
  
  iVar6 = cinfo->global_state;
  switch(iVar6) {
  case 0xca:
    cinfo->buffered_image = 1;
    if (cinfo->arith_code == 0) {
      if (cinfo->progressive_mode == 0) {
        jinit_huff_decoder(cinfo);
      }
      else {
        jinit_phuff_decoder(cinfo);
      }
    }
    else {
      jinit_arith_decoder(cinfo);
    }
    iVar6 = 1;
    jinit_d_coef_controller(cinfo,1);
    (*cinfo->mem->realize_virt_arrays)((j_common_ptr)cinfo);
    (*cinfo->inputctl->start_input_pass)(cinfo);
    pjVar4 = cinfo->progress;
    if (pjVar4 != (jpeg_progress_mgr *)0x0) {
      if (cinfo->progressive_mode == 0) {
        if (cinfo->inputctl->has_multiple_scans != 0) {
          iVar6 = cinfo->num_components;
        }
      }
      else {
        iVar6 = cinfo->num_components * 3 + 2;
      }
      pjVar4->pass_counter = 0;
      pjVar4->pass_limit = (long)iVar6 * (ulong)cinfo->total_iMCU_rows;
      pjVar4->completed_passes = 0;
      pjVar4->total_passes = 1;
    }
    cinfo->global_state = 0xd1;
  case 0xd1:
    pjVar4 = cinfo->progress;
    while( true ) {
      if (pjVar4 != (jpeg_progress_mgr *)0x0) {
        (*pjVar4->progress_monitor)((j_common_ptr)cinfo);
      }
      uVar2 = (*cinfo->inputctl->consume_input)(cinfo);
      if (uVar2 == 0) goto LAB_0010ec42;
      if (uVar2 == 2) break;
      pjVar4 = cinfo->progress;
      if ((uVar2 & 0xfffffffd) == 1 && pjVar4 != (jpeg_progress_mgr *)0x0) {
        lVar5 = pjVar4->pass_counter + 1;
        pjVar4->pass_counter = lVar5;
        if (pjVar4->pass_limit <= lVar5) {
          pjVar4->pass_limit = pjVar4->pass_limit + (ulong)cinfo->total_iMCU_rows;
        }
      }
    }
    cinfo->global_state = 0xd2;
    iVar6 = 0xd2;
switchD_0010eafe_caseD_cf:
    if (cinfo->buffered_image == 0) {
switchD_0010eafe_caseD_cb:
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x14;
      (pjVar1->msg_parm).i[0] = iVar6;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_0010ec42:
      ppjVar3 = (jvirt_barray_ptr *)0x0;
    }
    else {
      ppjVar3 = cinfo->coef->coef_arrays;
    }
    return ppjVar3;
  default:
    goto switchD_0010eafe_caseD_cb;
  case 0xcf:
  case 0xd2:
    goto switchD_0010eafe_caseD_cf;
  }
}

Assistant:

GLOBAL(jvirt_barray_ptr *)
jpeg_read_coefficients(j_decompress_ptr cinfo)
{
  if (cinfo->global_state == DSTATE_READY) {
    /* First call: initialize active modules */
    transdecode_master_selection(cinfo);
    cinfo->global_state = DSTATE_RDCOEFS;
  }
  if (cinfo->global_state == DSTATE_RDCOEFS) {
    /* Absorb whole file into the coef buffer */
    for (;;) {
      int retcode;
      /* Call progress monitor hook if present */
      if (cinfo->progress != NULL)
        (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
      /* Absorb some more input */
      retcode = (*cinfo->inputctl->consume_input) (cinfo);
      if (retcode == JPEG_SUSPENDED)
        return NULL;
      if (retcode == JPEG_REACHED_EOI)
        break;
      /* Advance progress counter if appropriate */
      if (cinfo->progress != NULL &&
          (retcode == JPEG_ROW_COMPLETED || retcode == JPEG_REACHED_SOS)) {
        if (++cinfo->progress->pass_counter >= cinfo->progress->pass_limit) {
          /* startup underestimated number of scans; ratchet up one scan */
          cinfo->progress->pass_limit += (long)cinfo->total_iMCU_rows;
        }
      }
    }
    /* Set state so that jpeg_finish_decompress does the right thing */
    cinfo->global_state = DSTATE_STOPPING;
  }
  /* At this point we should be in state DSTATE_STOPPING if being used
   * standalone, or in state DSTATE_BUFIMAGE if being invoked to get access
   * to the coefficients during a full buffered-image-mode decompression.
   */
  if ((cinfo->global_state == DSTATE_STOPPING ||
       cinfo->global_state == DSTATE_BUFIMAGE) && cinfo->buffered_image) {
    return cinfo->coef->coef_arrays;
  }
  /* Oops, improper usage */
  ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  return NULL;                  /* keep compiler happy */
}